

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int cm_zlib_deflateEnd(z_streamp strm)

{
  Bytef *pBVar1;
  Posf *pPVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = deflateStateCheck(strm);
  iVar4 = -2;
  if (iVar3 == 0) {
    iVar3 = strm->state->status;
    pBVar1 = strm->state->pending_buf;
    if (pBVar1 != (Bytef *)0x0) {
      (*strm->zfree)(strm->opaque,pBVar1);
    }
    pPVar2 = strm->state->head;
    if (pPVar2 != (Posf *)0x0) {
      (*strm->zfree)(strm->opaque,pPVar2);
    }
    pPVar2 = strm->state->prev;
    if (pPVar2 != (Posf *)0x0) {
      (*strm->zfree)(strm->opaque,pPVar2);
    }
    pBVar1 = strm->state->window;
    if (pBVar1 != (Bytef *)0x0) {
      (*strm->zfree)(strm->opaque,pBVar1);
    }
    (*strm->zfree)(strm->opaque,strm->state);
    strm->state = (internal_state *)0x0;
    iVar4 = (uint)(iVar3 != 0x71) * 3 + -3;
  }
  return iVar4;
}

Assistant:

int ZEXPORT deflateEnd (strm)
    z_streamp strm;
{
    int status;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;

    status = strm->state->status;

    /* Deallocate in reverse order of allocations: */
    TRY_FREE(strm, strm->state->pending_buf);
    TRY_FREE(strm, strm->state->head);
    TRY_FREE(strm, strm->state->prev);
    TRY_FREE(strm, strm->state->window);

    ZFREE(strm, strm->state);
    strm->state = Z_NULL;

    return status == BUSY_STATE ? Z_DATA_ERROR : Z_OK;
}